

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

UBool __thiscall icu_63::UVector::equals(UVector *this,UVector *other)

{
  uint uVar1;
  UBool UVar2;
  UBool UVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = this->count;
  if (uVar1 == other->count) {
    if (this->comparer == (UElementsAreEqual *)0x0) {
      UVar3 = '\x01';
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if (this->elements[uVar4].pointer != other->elements[uVar4].pointer) goto LAB_0030d18a;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
    }
    else {
      UVar3 = '\x01';
      if (0 < this->count) {
        lVar5 = 0;
        lVar6 = 0;
        do {
          UVar2 = (*this->comparer)((void *)((long)other->elements + lVar5),
                                    *(UElement *)((long)this->elements + lVar5));
          if (UVar2 == '\0') goto LAB_0030d18a;
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar6 < this->count);
      }
    }
  }
  else {
LAB_0030d18a:
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool   UVector::equals(const UVector &other) const {
    int      i;

    if (this->count != other.count) {
        return FALSE;
    }
    if (comparer == 0) {
        for (i=0; i<count; i++) {
            if (elements[i].pointer != other.elements[i].pointer) {
                return FALSE;
            }
        }
    } else {
        UElement key;
        for (i=0; i<count; i++) {
            key.pointer = &other.elements[i];
            if (!(*comparer)(key, elements[i])) {
                return FALSE;
            }
        }
    }
    return TRUE;
}